

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::ProducedDirectoryNodeTask::provideValue
          (ProducedDirectoryNodeTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  bool bVar4;
  StringRef path_00;
  StringList local_318;
  BuildKey *local_308;
  char *local_300;
  BuildKey local_2f8;
  KeyType local_2d8;
  char *local_2b8;
  unsigned_long local_2b0;
  char *local_2a8 [2];
  char *local_298;
  char *local_290;
  char *local_288 [2];
  undefined1 local_278 [8];
  StringRef path;
  undefined1 local_1f8 [8];
  BuildValue value;
  ValueType *valueData_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  ProducedDirectoryNodeTask *this_local;
  TaskInterface ti_local;
  char *local_f0;
  char *local_e8;
  char **local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  int local_ac;
  char *local_a8;
  char **local_a0;
  char *local_98;
  char **local_90;
  StringRef *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  iterator local_60;
  int local_54;
  unsigned_long local_50;
  char *local_48;
  unsigned_long local_40;
  undefined1 *local_38;
  undefined1 local_30 [16];
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  ti_local.impl = ti.ctx;
  this_local = (ProducedDirectoryNodeTask *)ti.impl;
  value.stringValues.size = (uint64_t)valueData;
  if (inputID == 0) {
    llbuild::buildsystem::BuildValue::fromData((BuildValue *)local_1f8,valueData);
    if (this->producingCommand == (Command *)0x0) {
      __assert_fail("producingCommand",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x360,
                    "virtual void (anonymous namespace)::ProducedDirectoryNodeTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    (*(this->producingCommand->super_JobDescriptor)._vptr_JobDescriptor[0xd])
              (&path.Length,this->producingCommand,this->node,local_1f8);
    llbuild::buildsystem::BuildValue::operator=(&this->nodeResult,(BuildValue *)&path.Length);
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&path.Length);
    bVar1 = llbuild::buildsystem::BuildValue::isExistingInput(&this->nodeResult);
    if (bVar1) {
      _local_278 = llbuild::buildsystem::Node::getName(this->node);
      local_a0 = local_288;
      local_a8 = "/";
      local_288[0] = "/";
      local_78 = (char *)strlen("/");
      local_80 = local_288[0];
      local_88 = (StringRef *)local_278;
      bVar1 = false;
      if (local_78 <= path.Data) {
        local_60 = llvm::StringRef::end(local_88);
        local_60 = local_60 + -(long)local_78;
        local_68 = local_80;
        local_70 = local_78;
        if (local_78 == (char *)0x0) {
          local_54 = 0;
        }
        else {
          local_54 = memcmp(local_60,local_80,(size_t)local_78);
        }
        bVar1 = local_54 == 0;
      }
      bVar4 = false;
      if (bVar1) {
        local_298 = (char *)local_278;
        local_290 = path.Data;
        local_90 = local_2a8;
        local_98 = "/";
        local_2a8[0] = "/";
        local_d0 = (char *)strlen("/");
        local_f0 = local_298;
        local_e8 = local_290;
        local_d8 = local_2a8[0];
        local_e0 = &local_f0;
        bVar4 = false;
        if (local_290 == local_d0) {
          local_b8 = local_298;
          local_c0 = local_2a8[0];
          local_c8 = local_d0;
          if (local_d0 == (char *)0x0) {
            local_ac = 0;
          }
          else {
            local_ac = memcmp(local_298,local_2a8[0],(size_t)local_d0);
          }
          bVar4 = local_ac == 0;
        }
        bVar4 = (bool)(bVar4 ^ 1);
      }
      if (bVar4) {
        ti_local.ctx = local_278;
        local_48 = path.Data + -1;
        local_40 = 0;
        local_38 = (undefined1 *)ti_local.ctx;
        puVar2 = std::min<unsigned_long>(&local_40,(unsigned_long *)&path);
        local_40 = *puVar2;
        pcVar3 = (char *)((long)local_278 + local_40);
        local_50 = (long)path.Data - local_40;
        puVar2 = std::min<unsigned_long>((unsigned_long *)&local_48,&local_50);
        local_2b0 = *puVar2;
        local_10 = local_30;
        path.Data = (char *)local_2b0;
        local_278 = (undefined1  [8])pcVar3;
        local_2b8 = pcVar3;
        local_20 = local_2b0;
        local_18 = pcVar3;
      }
      local_308 = (BuildKey *)local_278;
      local_300 = path.Data;
      llbuild::basic::StringList::StringList(&local_318);
      path_00.Length = (size_t)&local_318;
      path_00.Data = local_300;
      llbuild::buildsystem::BuildKey::makeDirectoryTreeSignature
                (&local_2f8,local_308,path_00,(StringList *)key);
      llbuild::buildsystem::BuildKey::toData(&local_2d8,&local_2f8);
      llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_2d8,1);
      llbuild::core::KeyType::~KeyType(&local_2d8);
      llbuild::buildsystem::BuildKey::~BuildKey(&local_2f8);
      llbuild::basic::StringList::~StringList(&local_318);
      this->returnDirectorySignature = true;
    }
    llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_1f8);
  }
  else if (inputID == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directorySignature,valueData);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    if (inputID == 0) {
      auto value = BuildValue::fromData(valueData);

      // Extract the node result from the command.
      assert(producingCommand);

      // NOTE: nodeResult only contains stat info of the directory, not its signature.
      nodeResult = producingCommand->getResultForOutput(&node, value);

      if (nodeResult.isExistingInput()) {
        // The external command must have produced the directory node.
        // Request for its signature and store it

        StringRef path =  node.getName();
        if (path.endswith("/") && path != "/") {
          path = path.substr(0, path.size() - 1);
        }
        ti.request(BuildKey::makeDirectoryTreeSignature(path,basic::StringList()).toData(), /*inputID=*/1);
        returnDirectorySignature = true;
      }
    } else if (inputID == 1) {
      directorySignature = valueData;
    }
  }